

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O2

IntrRecvError InterruptibleRecv(uint8_t *data,size_t len,milliseconds timeout,Sock *sock)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  IntrRecvError IVar4;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
  tVar5;
  int extraout_var;
  int *piVar7;
  long lVar8;
  long lVar9;
  long in_FS_OFFSET;
  long lVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  tVar5 = Now<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000l>>>>
                    ();
  lVar8 = timeout.__r + (long)tVar5.__d.__r;
  while ((len != 0 &&
         (lVar9 = lVar8 - (long)tVar5.__d.__r, lVar9 != 0 && (long)tVar5.__d.__r <= lVar8))) {
    iVar3 = (*sock->_vptr_Sock[4])(sock,data,len,0);
    lVar6 = CONCAT44(extraout_var,iVar3);
    if (lVar6 == 0 || extraout_var < 0) {
      if (lVar6 == 0) {
        IVar4 = Disconnected;
      }
      else {
        piVar7 = __errno_location();
        iVar3 = *piVar7;
        if (((iVar3 == 0xb) || (iVar3 == 0x73)) || (iVar3 == 0x16)) {
          if (999 < lVar9) {
            lVar9 = 1000;
          }
          iVar3 = (*sock->_vptr_Sock[0xe])(sock,lVar9,1);
          if ((char)iVar3 != '\0') goto LAB_00587c6c;
        }
        IVar4 = NetworkError;
      }
      goto LAB_00587c94;
    }
    len = len - lVar6;
    data = data + lVar6;
LAB_00587c6c:
    bVar2 = CThreadInterrupt::operator_cast_to_bool(&g_socks5_interrupt);
    if (bVar2) {
      IVar4 = Interrupted;
      goto LAB_00587c94;
    }
    tVar5 = Now<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000l>>>>
                      ();
  }
  IVar4 = (IntrRecvError)(len != 0);
LAB_00587c94:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return IVar4;
}

Assistant:

static IntrRecvError InterruptibleRecv(uint8_t* data, size_t len, std::chrono::milliseconds timeout, const Sock& sock)
{
    auto curTime{Now<SteadyMilliseconds>()};
    const auto endTime{curTime + timeout};
    while (len > 0 && curTime < endTime) {
        ssize_t ret = sock.Recv(data, len, 0); // Optimistically try the recv first
        if (ret > 0) {
            len -= ret;
            data += ret;
        } else if (ret == 0) { // Unexpected disconnection
            return IntrRecvError::Disconnected;
        } else { // Other error or blocking
            int nErr = WSAGetLastError();
            if (nErr == WSAEINPROGRESS || nErr == WSAEWOULDBLOCK || nErr == WSAEINVAL) {
                // Only wait at most MAX_WAIT_FOR_IO at a time, unless
                // we're approaching the end of the specified total timeout
                const auto remaining = std::chrono::milliseconds{endTime - curTime};
                const auto timeout = std::min(remaining, std::chrono::milliseconds{MAX_WAIT_FOR_IO});
                if (!sock.Wait(timeout, Sock::RECV)) {
                    return IntrRecvError::NetworkError;
                }
            } else {
                return IntrRecvError::NetworkError;
            }
        }
        if (g_socks5_interrupt) {
            return IntrRecvError::Interrupted;
        }
        curTime = Now<SteadyMilliseconds>();
    }
    return len == 0 ? IntrRecvError::OK : IntrRecvError::Timeout;
}